

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalNinjaGenerator::cmLocalNinjaGenerator
          (cmLocalNinjaGenerator *this,cmGlobalGenerator *gg,cmMakefile *mf)

{
  _Rb_tree_header *p_Var1;
  
  cmLocalCommonGenerator::cmLocalCommonGenerator(&this->super_cmLocalCommonGenerator,gg,mf);
  (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
  _vptr_cmOutputConverter = (_func_int **)&PTR__cmLocalNinjaGenerator_00b23f78;
  (this->HomeRelativeOutputPath)._M_dataplus._M_p = (pointer)&(this->HomeRelativeOutputPath).field_2
  ;
  (this->HomeRelativeOutputPath)._M_string_length = 0;
  (this->HomeRelativeOutputPath).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CustomCommandTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CustomCommands).
  super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CustomCommands).
  super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CustomCommands).
  super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

cmLocalNinjaGenerator::cmLocalNinjaGenerator(cmGlobalGenerator* gg,
                                             cmMakefile* mf)
  : cmLocalCommonGenerator(gg, mf)
{
}